

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

void GenCodeCmdGetAddr(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  x86Reg reg1;
  x86Reg targetReg;
  CodeGenRegVmContext *ctx_local;
  RegVmCmd cmd_local;
  
  reg1 = CodeGenGenericContext::GetReg(&ctx->ctx);
  ctx_local._3_1_ = cmd.rC;
  ctx_local._4_4_ = cmd.argument;
  ctx_local._1_1_ = cmd.rA;
  if (ctx_local._3_1_ == 1) {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,reg1,sQWORD,rR15,ctx_local._4_4_);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,reg1);
  }
  else if (ctx_local._3_1_ == 2) {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,reg1,sQWORD,rR14,ctx_local._4_4_);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,reg1);
  }
  else {
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,reg1,sQWORD,rEBX,(uint)ctx_local._3_1_ << 3);
    EMIT_OP_REG_NUM(&ctx->ctx,o_add64,reg1,ctx_local._4_4_);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov64,sQWORD,rEBX,(uint)ctx_local._1_1_ << 3,reg1);
  }
  return;
}

Assistant:

void GenCodeCmdGetAddr(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	x86Reg targetReg = ctx.ctx.GetReg();

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, targetReg, sQWORD, rR15, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
	else if(cmd.rC == rvrrConstants)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, targetReg, sQWORD, rR14, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, cmd.rC * 8); // Load source pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_add64, targetReg, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov64, sQWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
#else
	x86Reg targetReg = ctx.ctx.GetReg();

	if(cmd.rC == rvrrFrame)
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, targetReg, sDWORD, rESI, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
	else
	{
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rREG, cmd.rC * 8); // Load source pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_add, targetReg, cmd.argument); // Add offset
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rREG, cmd.rA * 8, targetReg); // Store to target
	}
#endif
}